

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressedFRQI.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  QObject<double> *pQVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  long *plVar8;
  uint *puVar9;
  long lVar10;
  pointer pdVar11;
  undefined8 uVar12;
  vector<double,_std::allocator<double>_> *a;
  double *pdVar13;
  pointer puVar14;
  ulong uVar15;
  ulong uVar16;
  undefined4 uVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  int iVar19;
  int iVar20;
  size_t maxval;
  vector<double,_std::allocator<double>_> state;
  vector<double,_std::allocator<double>_> data;
  size_t ncols;
  size_t nrows;
  QCircuit<double,_qclab::QObject<double>_> circuit;
  string fileNamePGM;
  string fileNameOut;
  string fileNameQASM;
  string fileNameIn;
  ofstream ostrm;
  stringstream qasm;
  allocator_type local_541;
  size_t local_540;
  double local_538;
  vector<double,_std::allocator<double>_> local_530;
  vector<double,_std::allocator<double>_> local_518;
  double local_4f8;
  size_t local_4f0;
  size_t local_4e8;
  undefined4 local_4e0;
  uint local_4dc;
  QCircuit<double,_qclab::QObject<double>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  double local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  string local_440;
  string local_420;
  string local_400;
  long *local_3e0;
  long local_3d8;
  long local_3d0 [2];
  value_type_conflict local_3c0;
  undefined1 local_3b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8 [14];
  ios_base local_2c0 [264];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b8 [2];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  if (argc == 2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_3b8,argv[1],(allocator<char> *)local_1b8);
    iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_3b8,"--help");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._0_8_ != local_3a8) {
      operator_delete((void *)local_3b8._0_8_,local_3a8[0]._M_allocated_capacity + 1);
    }
    if (iVar4 == 0) {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
      std::ostream::put('p');
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"QPIXL++: Compile quantum circuits for image representations",0x3b);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"***********************************************************",0x3b);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      plVar8 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
      std::ostream::put((char)plVar8);
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"compressedFRQI requires two mandatory input arguments, ",0x37);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"and two optional input arguments.",0x21);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      plVar8 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
      std::ostream::put((char)plVar8);
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"1. path to input PGM image file. Image data is expected",0x37);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"   in ASCII portable gray map format without comment.",0x35);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      plVar8 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
      std::ostream::put((char)plVar8);
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"2. path and name structure for all output data.",0x2f);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"   For example : ",0x11);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"       /mypath/output ",0x16);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"       This will generate output.qasm, output.pgm, and ",0x37);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"       output_sim.pgm (depending on optional parameters)",0x38);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"       in /mypath/",0x12);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      plVar8 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
      std::ostream::put((char)plVar8);
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"3. (optional) compression level between 0 and 100 percent",0x39);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"   default compression level is 0.",0x22);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      plVar8 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
      std::ostream::put((char)plVar8);
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"4. (optional) simulate flag: 0 or 1 to determine if circuit",0x3b);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"   is simulated with QCLAB++, default is 0.",0x2b);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      plVar8 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
      std::ostream::put((char)plVar8);
      std::ostream::flush();
      return 0;
    }
LAB_00106c75:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ERROR -- input and output filenames are required!",0x31);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'P');
    std::ostream::put('P');
    poVar7 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Use --help for more more .",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    return -1;
  }
  if (argc < 3) goto LAB_00106c75;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e0,argv[1],(allocator<char> *)local_3b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_488,argv[2],(allocator<char> *)local_3b8);
  if (argc == 3) {
    local_538 = 0.0;
LAB_00106e6c:
    uVar17 = 0;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_3b8,argv[3],(allocator<char> *)&local_4d8);
    uVar12 = local_3b8._0_8_;
    puVar9 = (uint *)__errno_location();
    uVar1 = *puVar9;
    paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(ulong)uVar1;
    *puVar9 = 0;
    local_538 = strtod((char *)uVar12,(char **)local_1b8);
    if (local_1b8[0] ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)uVar12) {
      std::__throw_invalid_argument("stod");
LAB_0010821a:
      std::__throw_invalid_argument("stoi");
LAB_00108226:
      uVar12 = std::__throw_out_of_range("stoi");
      if ((uint *)local_440._M_dataplus._M_p != puVar9) {
        operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
      }
      if (local_530.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_530.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_530.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_530.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._M_dataplus._M_p != paVar18) {
        operator_delete(local_4a8._M_dataplus._M_p,
                        CONCAT71(local_4a8.field_2._M_allocated_capacity._1_7_,
                                 local_4a8.field_2._M_local_buf[0]) + 1);
      }
      std::ofstream::~ofstream(local_3b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           **)local_460._M_dataplus._M_p != local_1b8) {
        operator_delete(local_460._M_dataplus._M_p,
                        CONCAT71(local_460.field_2._M_allocated_capacity._1_7_,
                                 local_460.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      local_4d8.super_QObject<double>._vptr_QObject = (_func_int **)&PTR_nbQubits_00126980;
      std::
      vector<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
      ::~vector(&local_4d8.gates_);
      if (local_518.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_518.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_518.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_518.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488._M_dataplus._M_p != &local_488.field_2) {
        operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
      }
      if (local_3e0 != local_3d0) {
        operator_delete(local_3e0,local_3d0[0] + 1);
      }
      _Unwind_Resume(uVar12);
    }
    if (*puVar9 == 0) {
LAB_00106db0:
      *puVar9 = uVar1;
    }
    else if (*puVar9 == 0x22) {
      std::__throw_out_of_range("stod");
      goto LAB_00106db0;
    }
    paVar18 = local_3a8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._0_8_ != paVar18) {
      operator_delete((void *)local_3b8._0_8_,local_3a8[0]._M_allocated_capacity + 1);
    }
    if ((uint)argc < 5) goto LAB_00106e6c;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_3b8,argv[4],(allocator<char> *)&local_4d8);
    uVar12 = local_3b8._0_8_;
    uVar1 = *puVar9;
    *puVar9 = 0;
    lVar10 = strtol((char *)local_3b8._0_8_,(char **)local_1b8,10);
    if (local_1b8[0] ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)uVar12) goto LAB_0010821a;
    if (((int)lVar10 != lVar10) || (*puVar9 == 0x22)) goto LAB_00108226;
    if (*puVar9 == 0) {
      *puVar9 = uVar1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._0_8_ != paVar18) {
      operator_delete((void *)local_3b8._0_8_,local_3a8[0]._M_allocated_capacity + 1);
    }
    uVar17 = (undefined4)CONCAT71((int7)((ulong)local_1b8 >> 8),(int)lVar10 == 1);
  }
  local_518.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_518.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_518.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," * Reading image data from file.. ",0x22);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_3e0,local_3d8 + (long)local_3e0);
  iVar4 = qpixl::readPGMA<std::vector<double,std::allocator<double>>>
                    (&local_400,&local_518,&local_4e8,&local_4f0,&local_540,2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
  }
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ERROR -- reading input image file",0x21);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'P');
    std::ostream::put('P');
    iVar5 = -2;
    std::ostream::flush();
    goto LAB_001081a1;
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"   Image statistics : ",0x16);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"     * number of rows             : ",0x24);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"     * number of columns          : ",0x24);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"     * maximum pixel value        : ",0x24);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"     * size of zero padded vector : ",0x24);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  plVar8 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
  std::ostream::put((char)plVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," * Converting grayscale to angles.. ",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  if (local_518.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_518.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    pdVar11 = local_518.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      *pdVar11 = *pdVar11 *
                 (1.5707963267948966 /
                 (((double)CONCAT44(0x45300000,(int)(local_540 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_540) - 4503599627370496.0)));
      pdVar11 = pdVar11 + 1;
    } while (pdVar11 !=
             local_518.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," * Compressing FRQI circuit.. ",0x1e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  qpixl::frqi::compressedFRQICircuit<std::vector<double,std::allocator<double>>>
            (&local_4d8,(frqi *)&local_518,a,local_538);
  iVar4 = local_4d8.nbQubits_ - 1;
  local_4e0 = uVar17;
  if (local_4d8.gates_.
      super__Vector_base<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_4d8.gates_.
      super__Vector_base<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar20 = 0;
    iVar19 = 0;
    iVar5 = iVar4;
  }
  else {
    iVar19 = 0;
    iVar20 = 0;
    puVar14 = local_4d8.gates_.
              super__Vector_base<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar5 = (**((puVar14->_M_t).
                  super___uniq_ptr_impl<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_qclab::QObject<double>_*,_std::default_delete<qclab::QObject<double>_>_>
                  .super__Head_base<0UL,_qclab::QObject<double>_*,_false>._M_head_impl)->
                 _vptr_QObject)();
      iVar20 = iVar20 + (uint)(iVar5 != 1);
      iVar19 = iVar19 + (uint)(iVar5 == 1);
      puVar14 = puVar14 + 1;
    } while (puVar14 !=
             local_4d8.gates_.
             super__Vector_base<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    iVar5 = local_4d8.nbQubits_ - 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," * Writing compressed FRQI circuit to QASM.. ",0x2d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  if (local_4d8.gates_.
      super__Vector_base<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_4d8.gates_.
      super__Vector_base<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      puVar14 = local_4d8.gates_.
                super__Vector_base<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 1;
      pQVar2 = ((local_4d8.gates_.
                 super__Vector_base<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_t).
               super___uniq_ptr_impl<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_qclab::QObject<double>_*,_std::default_delete<qclab::QObject<double>_>_>
               .super__Head_base<0UL,_qclab::QObject<double>_*,_false>._M_head_impl;
      iVar6 = (*pQVar2->_vptr_QObject[0xb])(pQVar2,local_1a8,(ulong)(uint)local_4d8.offset_);
      if (iVar6 != 0) break;
      local_4d8.gates_.
      super__Vector_base<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = puVar14;
    } while (puVar14 !=
             local_4d8.gates_.
             super__Vector_base<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_460._M_string_length = 0;
  local_460.field_2._M_local_buf[0] = '\0';
  local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (&local_460,local_488._M_dataplus._M_p,local_488._M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_460,".qasm");
  std::ofstream::ofstream(local_3b8,(string *)&local_460,_S_out);
  local_4dc = local_4d8.nbQubits_;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3b8,"// Generated by QPIXL++",0x17);
  std::ios::widen((char)(ostream *)local_3b8 + (char)*(undefined8 *)(local_3b8._0_8_ + -0x18));
  std::ostream::put((char)local_3b8);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"// https://github.com/QuantumComputingLab/qpixlpp",0x31);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  plVar8 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
  std::ostream::put((char)plVar8);
  plVar8 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
  std::ostream::put((char)plVar8);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"//   Circuit statistics : ",0x1a);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"//     * number of qubits               : ",0x2a);
  plVar8 = (long *)std::ostream::operator<<(poVar7,local_4d8.nbQubits_);
  std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
  std::ostream::put((char)plVar8);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"//     * total number of gates          : ",0x2a);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"//       - number of CNOTs              : ",0x2a);
  plVar8 = (long *)std::ostream::operator<<(poVar7,iVar20);
  std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
  std::ostream::put((char)plVar8);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"//       - number of Ry gates           : ",0x2a);
  iVar19 = iVar19 - iVar4;
  plVar8 = (long *)std::ostream::operator<<(poVar7,iVar19);
  std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
  std::ostream::put((char)plVar8);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"//       - number of Hadamard gates     : ",0x2a);
  plVar8 = (long *)std::ostream::operator<<(poVar7,iVar4);
  std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
  std::ostream::put((char)plVar8);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"//     * Compression setting            : ",0x2a);
  poVar7 = std::ostream::_M_insert<double>(local_538);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"//       - CNOT compression ratio [%]   : ",0x2a);
  local_4f8 = (double)(1 << ((byte)iVar5 & 0x1f));
  local_468 = (1.0 - (double)iVar20 / local_4f8) * 100.0;
  poVar7 = std::ostream::_M_insert<double>(local_468);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"//       - Ry compression ratio [%]     : ",0x2a);
  local_4f8 = (1.0 - (double)iVar19 / local_4f8) * 100.0;
  poVar7 = std::ostream::_M_insert<double>(local_4f8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  plVar8 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
  std::ostream::put((char)plVar8);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"OPENQASM 2.0;",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"include \"qelib1.inc\";",0x15);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  plVar8 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
  std::ostream::put((char)plVar8);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"qreg q[",7);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_4dc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"];",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  poVar7 = (ostream *)std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,local_4a8._M_dataplus._M_p,local_4a8._M_string_length);
  paVar18 = &local_4a8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != paVar18) {
    operator_delete(local_4a8._M_dataplus._M_p,
                    CONCAT71(local_4a8.field_2._M_allocated_capacity._1_7_,
                             local_4a8.field_2._M_local_buf[0]) + 1);
  }
  std::ofstream::close();
  lVar10 = std::cout;
  *(uint *)(atan2f + *(long *)(std::cout + -0x18)) =
       *(uint *)(atan2f + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(operator_delete__ + *(long *)(lVar10 + -0x18)) = 1;
  std::ios::widen((char)*(undefined8 *)(lVar10 + -0x18) + 'p');
  std::ostream::put('p');
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"   Circuit statistics : ",0x18);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"     * number of qubits               : ",0x28);
  plVar8 = (long *)std::ostream::operator<<(poVar7,local_4d8.nbQubits_);
  std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
  std::ostream::put((char)plVar8);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"     * total number of gates          : ",0x28);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"       - number of CNOTs              : ",0x28);
  plVar8 = (long *)std::ostream::operator<<(poVar7,iVar20);
  std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
  std::ostream::put((char)plVar8);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"       - number of Ry gates           : ",0x28);
  plVar8 = (long *)std::ostream::operator<<(poVar7,iVar19);
  std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
  std::ostream::put((char)plVar8);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"       - number of Hadamard gates     : ",0x28);
  plVar8 = (long *)std::ostream::operator<<(poVar7,iVar4);
  std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
  std::ostream::put((char)plVar8);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"     * Compression setting            : ",0x28);
  poVar7 = std::ostream::_M_insert<double>(local_538);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"       - CNOT compression ratio [%]   : ",0x28);
  poVar7 = std::ostream::_M_insert<double>(local_468);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"       - Ry compression ratio [%]     : ",0x28);
  poVar7 = std::ostream::_M_insert<double>(local_4f8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  plVar8 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
  std::ostream::put((char)plVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," * Converting compressed data to grayscale image.. ",0x33);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  qpixl::frqi::invGrayPermutation<std::vector<double,std::allocator<double>>>(&local_518);
  qpixl::frqi::isfwht<std::vector<double,std::allocator<double>>>(&local_518);
  pdVar13 = local_518.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_518.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_518.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    do {
      *pdVar13 = *pdVar13 * 0.5;
      pdVar13 = pdVar13 + 1;
    } while (pdVar13 !=
             local_518.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish);
    pdVar11 = local_518.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      *pdVar11 = *pdVar11 *
                 ((((double)CONCAT44(0x45300000,(int)(local_540 >> 0x20)) - 1.9342813113834067e+25)
                  + ((double)CONCAT44(0x43300000,(int)local_540) - 4503599627370496.0)) /
                 1.5707963267948966);
      pdVar11 = pdVar11 + 1;
    } while (pdVar11 !=
             local_518.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," * Writing compressed image to file.. ",0x26);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  local_4a8._M_string_length = 0;
  local_4a8.field_2._M_local_buf[0] = '\0';
  local_4a8._M_dataplus._M_p = (pointer)paVar18;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (&local_4a8,local_488._M_dataplus._M_p,local_488._M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_4a8,".pgm");
  local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_420,local_4a8._M_dataplus._M_p,
             local_4a8._M_dataplus._M_p + local_4a8._M_string_length);
  iVar4 = qpixl::writePGMA<std::vector<double,std::allocator<double>>>
                    (&local_420,&local_518,local_4e8,local_4f0,local_540,2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420._M_dataplus._M_p != &local_420.field_2) {
    operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
  }
  if (iVar4 == 0) {
    if ((char)local_4e0 != '\0') {
      local_3c0 = 0.0;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_530,1L << ((byte)local_4d8.nbQubits_ & 0x3f),&local_3c0,&local_541);
      *local_530.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_start = 1.0;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," * Simulating the compressed FRQI circuit.. ",0x2c);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
      std::ostream::put('p');
      std::ostream::flush();
      (*local_4d8.super_QObject<double>._vptr_QObject[8])
                (&local_4d8,0x4e,(ulong)(uint)local_4d8.nbQubits_,&local_530,0);
      if (local_530.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_530.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar16 = 0;
      }
      else {
        uVar15 = 0;
        do {
          dVar3 = atan2(local_530.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar15 + 1],
                        local_530.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar15]);
          *(double *)
           ((long)local_530.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + uVar15 * 4) = dVar3;
          uVar15 = uVar15 + 2;
          uVar16 = (long)local_530.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_530.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
        } while (uVar15 < uVar16);
      }
      std::vector<double,_std::allocator<double>_>::resize(&local_530,uVar16 >> 1);
      if (local_530.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_530.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pdVar11 = local_530.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          *pdVar11 = *pdVar11 *
                     ((((double)CONCAT44(0x45300000,(int)(local_540 >> 0x20)) -
                       1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)local_540) - 4503599627370496.0)) /
                     1.5707963267948966);
          pdVar11 = pdVar11 + 1;
        } while (pdVar11 !=
                 local_530.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," * Writing simulated compressed image to file.. ",0x30);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
      std::ostream::put('p');
      std::ostream::flush();
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_488,"_sim.pgm");
      local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_440,local_488._M_dataplus._M_p,
                 local_488._M_dataplus._M_p + local_488._M_string_length);
      iVar4 = qpixl::writePGMA<std::vector<double,std::allocator<double>>>
                        (&local_440,&local_530,local_4e8,local_4f0,local_540,2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_440._M_dataplus._M_p != &local_440.field_2) {
        operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
      }
      if (iVar4 == 0) {
        iVar5 = 0;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"ERROR -- writing simulated image file",0x25);
        iVar5 = -4;
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      }
      if (local_530.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_530.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_530.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_530.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (iVar4 != 0) goto LAB_001080f2;
    }
    iVar5 = 0;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ERROR -- writing compressed image file",0x26);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'P');
    std::ostream::put('P');
    iVar5 = -3;
    std::ostream::flush();
  }
LAB_001080f2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != paVar18) {
    operator_delete(local_4a8._M_dataplus._M_p,
                    CONCAT71(local_4a8.field_2._M_allocated_capacity._1_7_,
                             local_4a8.field_2._M_local_buf[0]) + 1);
  }
  local_3b8._0_8_ = _VTT;
  *(undefined8 *)(local_3b8 + *(long *)(_VTT->_M_local_buf + -0x18)) = _memcpy;
  std::filebuf::~filebuf((filebuf *)(local_3b8 + 8));
  std::ios_base::~ios_base(local_2c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p,
                    CONCAT71(local_460.field_2._M_allocated_capacity._1_7_,
                             local_460.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  local_4d8.super_QObject<double>._vptr_QObject = (_func_int **)&PTR_nbQubits_00126980;
  std::
  vector<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
  ::~vector(&local_4d8.gates_);
LAB_001081a1:
  if (local_518.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_518.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_518.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_518.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_dataplus._M_p != &local_488.field_2) {
    operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
  }
  if (local_3e0 == local_3d0) {
    return iVar5;
  }
  operator_delete(local_3e0,local_3d0[0] + 1);
  return iVar5;
}

Assistant:

int main( int argc , char *argv[] ) {

  // parse input arguments
  if ( argc == 2 ) {
    if ( std::string(argv[1]) == "--help" ) {
      std::cout << std::endl
                << "QPIXL++: Compile quantum circuits for image representations"
                << std::endl
                << "***********************************************************"
                << std::endl << std::endl
                << "compressedFRQI requires two mandatory input arguments, "
                << std::endl << "and two optional input arguments."
                << std::endl << std::endl
                << "1. path to input PGM image file. Image data is expected"
                << std::endl
                << "   in ASCII portable gray map format without comment."
                << std::endl << std::endl
                << "2. path and name structure for all output data."
                << std::endl
                << "   For example : " << std::endl
                << "       /mypath/output " << std::endl
                << "       This will generate output.qasm, output.pgm, and "
                << std::endl
                << "       output_sim.pgm (depending on optional parameters)"
                << std::endl
                << "       in /mypath/"
                << std::endl << std::endl
                << "3. (optional) compression level between 0 and 100 percent"
                << std::endl
                << "   default compression level is 0."
                << std::endl << std::endl
                << "4. (optional) simulate flag: 0 or 1 to determine if circuit"
                << std::endl
                << "   is simulated with QCLAB++, default is 0."
                << std::endl << std::endl ;
      return 0 ;
    }
  }
  if ( argc < 3 ) {
    std::cerr << "ERROR -- input and output filenames are required!" 
              << std::endl 
              << "Use --help for more more ."
              << std::endl ;
    return -1 ;
  }
  std::string fileNameIn(  argv[1] ) ;
  std::string fileNameOut( argv[2] ) ;
  double  compr  = 0 ; if ( argc > 3 ) compr  = std::stod( argv[3] ) ;
  int sim = 0 ; if ( argc > 4 ) sim = std::stoi( argv[4] ) ;

  // Read grayscale image data
  std::vector< double > data ;
  size_t nrows, ncols, maxval ;
  int s, zeroPad = 2 ;
  std::cout << " * Reading image data from file.. " << std::endl ;
  s = qpixl::readPGMA(fileNameIn , data , nrows , ncols , maxval , zeroPad) ;

  if ( s != 0 ) {
    std::cerr << "ERROR -- reading input image file" << std::endl;
    return -2 ;
  }

  // Image statistics
  std::cout << std::endl
              << "   Image statistics : " << std::endl
              << "     * number of rows             : " << nrows << std::endl
              << "     * number of columns          : " << ncols << std::endl
              << "     * maximum pixel value        : " << maxval << std::endl
              << "     * size of zero padded vector : " << data.size() 
              << std::endl << std::endl ;
    
  // Convert data to angles for FRQI
  std::cout << " * Converting grayscale to angles.. " << std::endl ;
  qpixl::frqi::convertToAngles( data , maxval ) ;

  // Create compressed FRQI circuit
  std::cout << " * Compressing FRQI circuit.. " << std::endl ;
  auto circuit = qpixl::frqi::compressedFRQICircuit( data , compr ) ;

  // Count CNOTs and single qubit gates in FRQI circuit
  int nCNOT = 0, nRY = 0 ;
  const int nH = circuit.nbQubits() - 1 ;
  using citer  = typename qclab::QCircuit< double >::const_iterator ;
  for ( citer it = circuit.begin(); it !=circuit.end(); it++ ) {
    if ( (*it)->nbQubits() == 1 ) nRY += 1 ;
    else nCNOT += 1 ;
  }
  nRY -= nH ;
  
  const double maxgates = int(1)<<(circuit.nbQubits()-1) ;

  // Write QASM to file
  std::cout << " * Writing compressed FRQI circuit to QASM.. " << std::endl ;
  std::stringstream qasm ;
  circuit.toQASM( qasm ) ;
  std::string fileNameQASM ;
  fileNameQASM.append( fileNameOut ) ;
  fileNameQASM.append( ".qasm" ) ;
  std::ofstream ostrm( fileNameQASM , std::ios::out ) ;
  const int N = circuit.nbQubits() ;
  ostrm << "// Generated by QPIXL++" << std::endl
        << "// https://github.com/QuantumComputingLab/qpixlpp" << std::endl
        << std::endl << std::endl
        << "//   Circuit statistics : " << std::endl
        << "//     * number of qubits               : " 
        << circuit.nbQubits() << std::endl
        << "//     * total number of gates          : " << circuit.nbGates()
        << std::endl
        << "//       - number of CNOTs              : " << nCNOT 
        << std::endl
        << "//       - number of Ry gates           : " << nRY 
        << std::endl
        << "//       - number of Hadamard gates     : " << nH 
        << std::endl
        << "//     * Compression setting            : " << compr
        << std::endl
        << "//       - CNOT compression ratio [%]   : " 
        << (1.0 - (double(nCNOT)/maxgates))*100
        << std::endl
        << "//       - Ry compression ratio [%]     : " 
        << (1.0 - (double(nRY)/maxgates))*100
        << std::endl << std::endl
        << "OPENQASM 2.0;" << std::endl
        << "include \"qelib1.inc\";" << std::endl << std::endl
        << "qreg q[" << N << "];" << std::endl
        << qasm.str() ;
  ostrm.close() ;

  // Circuit statistics
  std::cout << std::fixed ;
  std::cout << std::setprecision(1) ;
  std::cout << std::endl
            << "   Circuit statistics : " << std::endl
            << "     * number of qubits               : " 
            << circuit.nbQubits() << std::endl
            << "     * total number of gates          : " << circuit.nbGates()
            << std::endl
            << "       - number of CNOTs              : " << nCNOT 
            << std::endl
            << "       - number of Ry gates           : " << nRY
            << std::endl
            << "       - number of Hadamard gates     : " << nH 
            << std::endl
            << "     * Compression setting            : " << compr
            << std::endl
            << "       - CNOT compression ratio [%]   : " 
            << (1.0 - (double(nCNOT)/maxgates))*100
            << std::endl
            << "       - Ry compression ratio [%]     : " 
            << (1.0 - (double(nRY)/maxgates))*100
            << std::endl << std::endl ;

  // Transform data back to binary order, inverse FWHT, and grayscale map
  std::cout << " * Converting compressed data to grayscale image.. " 
            << std::endl ;

  qpixl::frqi::invGrayPermutation( data ) ;
  qpixl::frqi::isfwht( data ) ; 
  std::for_each( data.begin(), data.end(), []( double& n ){ n /= 2; } ) ;       
  qpixl::frqi::convertToGrayscale( data , maxval ) ;

  // Write image data to PGM
  std::cout << " * Writing compressed image to file.. " << std::endl ;
  std::string fileNamePGM ;
  fileNamePGM.append( fileNameOut ) ;
  fileNamePGM.append( ".pgm" ) ;
  s = qpixl::writePGMA(fileNamePGM , data , nrows , ncols , maxval ,
                       zeroPad) ;

  if ( s != 0 ) {
    std::cerr << "ERROR -- writing compressed image file" << std::endl;
    return -3 ;
  }

  // Simulate the circuit
  if ( sim == 1 ) { 

    // Initial state vector
    std::vector< double > state( (size_t(1)<<circuit.nbQubits()) , 0.0 );
    state[0] = 1.0 ;
    
    // Simulate
    std::cout << " * Simulating the compressed FRQI circuit.. " << std::endl ;
    circuit.simulate( state ) ;
    
    // Recover simulated image data from state vector
    for ( int i = 0; i < state.size(); i+=2 ) {
      state[i/2] = std::atan2( state[i+1] , state[i] ) ;
    }
    state.resize( state.size()/2 ) ;
    qpixl::frqi::convertToGrayscale( state , maxval ) ;

    // Write simulated image data to PGM
    std::cout << " * Writing simulated compressed image to file.. " 
              << std::endl ;
    fileNameOut.append( "_sim.pgm" ) ;
    s = qpixl::writePGMA(fileNameOut , state , nrows , ncols , maxval , 
                         zeroPad) ;

    if ( s != 0 ) {
      std::cerr << "ERROR -- writing simulated image file" << std::endl;
      return -4 ;
    }
  }

  // successful
  return 0 ;    
    
}